

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::character_either::scan(character_either *this,location *loc)

{
  char_type_conflict cVar1;
  bool bVar2;
  char_type_conflict cVar3;
  reference puVar4;
  location *in_RSI;
  region *in_RDI;
  location first;
  uchar c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  location *in_stack_ffffffffffffff48;
  location *in_stack_ffffffffffffff50;
  location *this_00;
  region *this_01;
  location *in_stack_ffffffffffffff70;
  location *in_stack_ffffffffffffff78;
  region *in_stack_ffffffffffffff80;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  this_01 = in_RDI;
  bVar2 = location::eof(in_stack_ffffffffffffff50);
  if (bVar2) {
    region::region(in_stack_ffffffffffffff80);
  }
  else {
    local_20 = &(in_RSI->source_).
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
    local_28._M_current =
         (uchar *)CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_ffffffffffffff48);
    CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff48);
    while (bVar2 = __gnu_cxx::
                   operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)in_stack_ffffffffffffff50,
                              (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)in_stack_ffffffffffffff48), ((bVar2 ^ 0xffU) & 1) != 0) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_28);
      cVar1 = *puVar4;
      cVar3 = location::current(in_stack_ffffffffffffff48);
      if (cVar3 == cVar1) {
        this_00 = (location *)&stack0xffffffffffffff80;
        location::location(in_stack_ffffffffffffff70,in_RSI);
        location::advance((location *)this_01,(size_t)in_RDI);
        region::region(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                      );
        location::~location(this_00);
        return this_01;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_28);
    }
    region::region(in_stack_ffffffffffffff80);
  }
  return this_01;
}

Assistant:

TOML11_INLINE region character_either::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    for(const auto c : this->chars_)
    {
        if(loc.current() == c)
        {
            const auto first = loc;
            loc.advance(1);
            return region(first, loc);
        }
    }
    return region{};
}